

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O3

void __thiscall
cmSearchPath::AddPrefixPaths
          (cmSearchPath *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths,char *base)

{
  pointer pcVar1;
  cmMakefile *this_00;
  int iVar2;
  long *plVar3;
  char *pcVar4;
  size_type *psVar5;
  pointer path;
  string add;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string dir;
  string subdir;
  string local_e8;
  cmSearchPath *local_c8;
  string local_c0;
  char *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a0 = base;
  local_78 = paths;
  if (this->FC == (cmFindCommon *)0x0) {
    __assert_fail("this->FC != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmSearchPath.cxx"
                  ,0xce,
                  "void cmSearchPath::AddPrefixPaths(const std::vector<std::string> &, const char *)"
                 );
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"bin","");
  iVar2 = std::__cxx11::string::compare((char *)&this->FC->CMakePathName);
  if (iVar2 == 0) {
    pcVar4 = "include";
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&this->FC->CMakePathName);
    if (iVar2 == 0) {
      pcVar4 = "lib";
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&this->FC->CMakePathName);
      if (iVar2 != 0) goto LAB_0029eeb3;
      pcVar4 = "";
    }
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_70,0,(char *)local_70._M_string_length,(ulong)pcVar4);
LAB_0029eeb3:
  path = (local_78->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  local_c8 = this;
  if (path != (local_78->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      pcVar1 = (path->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar1,pcVar1 + path->_M_string_length);
      if ((((char *)local_70._M_string_length != (char *)0x0) && (local_98._M_string_length != 0))
         && (local_98._M_dataplus._M_p[local_98._M_string_length - 1] != '/')) {
        std::__cxx11::string::append((char *)&local_98);
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_70);
      if (iVar2 == 0) {
LAB_0029ef59:
        this_00 = (local_c8->FC->super_cmCommand).Makefile;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,"CMAKE_LIBRARY_ARCHITECTURE","");
        pcVar4 = cmMakefile::GetDefinition(this_00,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
          std::operator+(&local_50,&local_98,&local_70);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          psVar5 = (size_type *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_c0.field_2._M_allocated_capacity = *psVar5;
            local_c0.field_2._8_8_ = plVar3[3];
          }
          else {
            local_c0.field_2._M_allocated_capacity = *psVar5;
            local_c0._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_c0._M_string_length = plVar3[1];
          *plVar3 = (long)psVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_c0);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          psVar5 = (size_type *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_e8.field_2._M_allocated_capacity = *psVar5;
            local_e8.field_2._8_8_ = plVar3[3];
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar5;
            local_e8._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_e8._M_string_length = plVar3[1];
          *plVar3 = (long)psVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          AddPathInternal(local_c8,&local_e8,local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_70);
        if (iVar2 == 0) goto LAB_0029ef59;
      }
      std::operator+(&local_e8,&local_98,&local_70);
      iVar2 = std::__cxx11::string::compare((char *)&local_e8);
      if (iVar2 != 0) {
        AddPathInternal(local_c8,&local_e8,local_a0);
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_70);
      if (iVar2 == 0) {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,local_98._M_dataplus._M_p,
                   local_98._M_dataplus._M_p + local_98._M_string_length);
        std::__cxx11::string::append((char *)&local_c0);
        AddPathInternal(local_c8,&local_c0,local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
      }
      if ((char *)local_70._M_string_length != (char *)0x0) {
        iVar2 = std::__cxx11::string::compare((char *)path);
        if (iVar2 != 0) {
          AddPathInternal(local_c8,path,local_a0);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      path = path + 1;
    } while (path != (local_78->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmSearchPath::AddPrefixPaths(const std::vector<std::string>& paths,
                                  const char *base)
{
  assert(this->FC != NULL);

  // default for programs
  std::string subdir = "bin";

  if (this->FC->CMakePathName == "INCLUDE")
    {
    subdir = "include";
    }
  else if (this->FC->CMakePathName == "LIBRARY")
    {
    subdir = "lib";
    }
  else if (this->FC->CMakePathName == "FRAMEWORK")
    {
    subdir = "";  // ? what to do for frameworks ?
    }

  for(std::vector<std::string>::const_iterator p = paths.begin();
      p != paths.end(); ++p)
    {
    std::string dir = *p;
    if(!subdir.empty() && !dir.empty() && *dir.rbegin() != '/')
      {
      dir += "/";
      }
    if(subdir == "include" || subdir == "lib")
      {
      const char* arch =
        this->FC->Makefile->GetDefinition("CMAKE_LIBRARY_ARCHITECTURE");
      if(arch && *arch)
        {
        this->AddPathInternal(dir+subdir+"/"+arch, base);
        }
      }
    std::string add = dir + subdir;
    if(add != "/")
      {
      this->AddPathInternal(add, base);
      }
    if (subdir == "bin")
      {
      this->AddPathInternal(dir+"sbin", base);
      }
    if(!subdir.empty() && *p != "/")
      {
      this->AddPathInternal(*p, base);
      }
    }
}